

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O2

void copyChannel(Image *src,Image *dest,int channel)

{
  uchar uVar1;
  Pixel PVar2;
  undefined8 in_RAX;
  Pixel *pPVar3;
  int y;
  uint y_00;
  int x;
  uint x_00;
  undefined8 uStack_38;
  
  if ((src != (Image *)0x0) && (dest != (Image *)0x0)) {
    uStack_38 = in_RAX;
    checkDimensionsEqualOrThrow(src,dest);
    checkValidColorChannelOrThrow(channel);
    for (y_00 = 0; y_00 < src->height; y_00 = y_00 + 1) {
      for (x_00 = 0; x_00 < src->width; x_00 = x_00 + 1) {
        PVar2 = Image::operator()(src,x_00,y_00);
        uStack_38 = CONCAT44(PVar2.colors,(undefined4)uStack_38);
        uVar1 = *(uchar *)((long)&uStack_38 + (long)channel + 4);
        pPVar3 = Image::operator()(dest,x_00,y_00);
        pPVar3->colors[channel] = uVar1;
      }
    }
    return;
  }
  __assert_fail("(src != nullptr) && (dest != nullptr)",
                "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                ,0xb5,"void copyChannel(const Image *, Image *, int)");
}

Assistant:

void copyChannel(const Image *src, Image *dest, int channel) {
  // Check arguments
  assert((src != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Just copy the value.
      dest->pixel(x, y).colors[channel] = src->pixel(x, y).colors[channel];
    }
  }
}